

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# explode.c
# Opt level: O0

void explode(float x,float y,int big)

{
  EXPLOSION *pEVar1;
  int in_EDI;
  float in_XMM0_Da;
  float in_XMM1_Da;
  EXPLOSION *e;
  
  pEVar1 = (EXPLOSION *)malloc(0x18);
  pEVar1->x = in_XMM0_Da;
  pEVar1->y = in_XMM1_Da;
  pEVar1->big = in_EDI;
  pEVar1->time = 0.0;
  pEVar1->next = explosions;
  explosions = pEVar1;
  return;
}

Assistant:

void explode(float x, float y, int big)
{
   EXPLOSION *e = malloc(sizeof(EXPLOSION));

   e->x = x;
   e->y = y;

   e->big = big;

   e->time = 0;

   e->next = explosions;
   explosions = e;
}